

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AIMultiplayer.cpp
# Opt level: O2

void XPMP2::AIMultiInit(void)

{
  bool bVar1;
  uint uVar2;
  uint nDrM;
  int iVar3;
  ulong uVar4;
  allocator<char> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  infoDataRefsTy drI;
  multiDataRefsTy drM;
  char buf [100];
  
  drTcasOverride = XPLMFindDataRef("sim/operation/override/override_TCAS");
  drMapOverride = XPLMFindDataRef("sim/operation/override/override_multiplayer_map_layer");
  numSlots = 0;
  drTcasModeS = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeS_id");
  if (drTcasModeS != 0) {
    uVar2 = XPLMGetDatavi(drTcasModeS,0,0,0);
    if (uVar2 < 2) {
      drTcasModeS = 0;
      numSlots = 0;
    }
    else {
      numSlots = (long)(int)uVar2 - 1;
      drTcasModeC = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeC_code");
      drTcasFlightId = XPLMFindDataRef("sim/cockpit2/tcas/targets/flight_id");
      drTcasIcaoType = XPLMFindDataRef("sim/cockpit2/tcas/targets/icao_type");
      drTcasX = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/x");
      drTcasY = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/y");
      drTcasZ = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/z");
      drTcasVX = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vx");
      drTcasVY = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vy");
      drTcasVZ = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vz");
      drTcasVertSpeed = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vertical_speed");
      drTcasHeading = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/psi");
      drTcasPitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/the");
      drTcasRoll = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/phi");
      drTcasGrnd = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/weight_on_wheels");
      drTcasGear = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/gear_deploy");
      drTcasFlap = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio");
      drTcasFlap2 = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio2");
      drTcasSpeedbrake = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/speedbrake_ratio");
      drTcasSlat = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/slat_ratio");
      drTcasWingSweep = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/wing_sweep");
      drTcasThrottle = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/throttle");
      drTcasYokePitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_pitch");
      if (drTcasYokePitch == 0) {
        drTcasYokePitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_pitch");
      }
      drTcasYokeRoll = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_roll");
      if (drTcasYokeRoll == 0) {
        drTcasYokeRoll = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_roll");
      }
      drTcasYokeYaw = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_yaw");
      if (drTcasYokeYaw == 0) {
        drTcasYokeYaw = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_yaw");
      }
      drTcasLights = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/lights");
      drTcasWakeWingSpan = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_span_m");
      drTcasWakeWingArea = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_area_m2");
      drTcasWakeCat = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wake_cat");
      drTcasWakeMass = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/mass_kg");
      drTcasWakeAoA = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/aoa");
      drTcasWakeLift = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/lift_N");
    }
  }
  if (DAT_002cb9a8 != gMultiRef) {
    DAT_002cb9a8 = gMultiRef;
  }
  memset(&drM,0,200);
  std::vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_>::push_back
            ((vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_> *)&gMultiRef,
             &drM);
  iVar3 = 1;
  while( true ) {
    drM.taxiLights = (XPLMDataRef)0x0;
    drM.yoke_pitch = (XPLMDataRef)0x0;
    drM.X = (XPLMDataRef)0x0;
    drM.Y = (XPLMDataRef)0x0;
    drM.Z = (XPLMDataRef)0x0;
    drM.pitch = (XPLMDataRef)0x0;
    drM.roll = (XPLMDataRef)0x0;
    drM.heading = (XPLMDataRef)0x0;
    snprintf(buf,100,"sim/multiplayer/position/plane%u_x",iVar3);
    drM.X = (XPLMDataRef)XPLMFindDataRef(buf);
    if (drM.X == (XPLMDataRef)0x0) break;
    snprintf(buf,100,"sim/multiplayer/position/plane%u_y",iVar3);
    drM.Y = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_z",iVar3);
    drM.Z = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_v_x",iVar3);
    drM.v_x = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_v_y",iVar3);
    drM.v_y = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_v_z",iVar3);
    drM.v_z = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_the",iVar3);
    drM.pitch = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_phi",iVar3);
    drM.roll = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_psi",iVar3);
    drM.heading = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_gear_deploy",iVar3);
    drM.gear = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_flap_ratio",iVar3);
    drM.flap = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_flap_ratio2",iVar3);
    drM.flap2 = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_spoiler_ratio",iVar3);
    drM.spoiler = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_speedbrake_ratio",iVar3);
    drM.speedbrake = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_slat_ratio",iVar3);
    drM.slat = (XPLMDataRef)XPLMFindDataRef(buf);
    if (drM.slat == (XPLMDataRef)0x0) {
      snprintf(buf,100,"sim/multiplayer/position/plane%u_sla1_ratio",iVar3);
      drM.slat = (XPLMDataRef)XPLMFindDataRef(buf);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_wing_sweep",iVar3);
    drM.wingSweep = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_throttle",iVar3);
    drM.throttle = (XPLMDataRef)XPLMFindDataRef(buf);
    if (numSlots == 0) {
      snprintf(buf,100,"sim/multiplayer/position/plane%u_yolk_pitch",iVar3);
      drM.yoke_pitch = (XPLMDataRef)XPLMFindDataRef(buf);
      snprintf(buf,100,"sim/multiplayer/position/plane%u_yolk_roll",iVar3);
      drM.yoke_roll = (XPLMDataRef)XPLMFindDataRef(buf);
      snprintf(buf,100,"sim/multiplayer/position/plane%u_yolk_yaw",iVar3);
      drM.yoke_yaw = (XPLMDataRef)XPLMFindDataRef(buf);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_beacon_lights_on",iVar3);
    drM.bcnLights = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_landing_lights_on",iVar3);
    drM.landLights = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_nav_lights_on",iVar3);
    drM.navLights = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_strobe_lights_on",iVar3);
    drM.strbLights = (XPLMDataRef)XPLMFindDataRef(buf);
    snprintf(buf,100,"sim/multiplayer/position/plane%u_taxi_light_on",iVar3);
    drM.taxiLights = (XPLMDataRef)XPLMFindDataRef(buf);
    bVar1 = multiDataRefsTy::operator_cast_to_bool(&drM);
    if (!bVar1) break;
    std::vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_>::push_back
              ((vector<XPMP2::multiDataRefsTy,_std::allocator<XPMP2::multiDataRefsTy>_> *)&gMultiRef
               ,&drM);
    iVar3 = iVar3 + 1;
  }
  if (numSlots == 0) {
    numSlots = (DAT_002cb9a8 - gMultiRef) / 200 - 1;
  }
  if (DAT_002cb9c0 != gInfoRef) {
    DAT_002cb9c0 = gInfoRef;
  }
  drI.infoAptTo = (XPLMDataRef)0x0;
  drI.cslModel = (XPLMDataRef)0x0;
  drI.infoFlightNum = (XPLMDataRef)0x0;
  drI.infoAptFrom = (XPLMDataRef)0x0;
  drI.infoIcaoAirline = (XPLMDataRef)0x0;
  drI.infoAirline = (XPLMDataRef)0x0;
  drI.infoManufacturer = (XPLMDataRef)0x0;
  drI.infoModel = (XPLMDataRef)0x0;
  drI.infoTailNum = (XPLMDataRef)0x0;
  drI.infoIcaoAcType = (XPLMDataRef)0x0;
  std::vector<XPMP2::infoDataRefsTy,_std::allocator<XPMP2::infoDataRefsTy>_>::push_back
            ((vector<XPMP2::infoDataRefsTy,_std::allocator<XPMP2::infoDataRefsTy>_> *)&gInfoRef,&drI
            );
  for (uVar4 = 1; uVar4 <= numSlots; uVar4 = (ulong)((int)uVar4 + 1)) {
    snprintf(buf,100,"sim/multiplayer/position/plane%u_tailnum",uVar4);
    iVar3 = XPLMShareData(buf,0x20,0,0);
    if (iVar3 == 0) {
      drI.infoTailNum = (XPLMDataRef)0x0;
    }
    else {
      drI.infoTailNum = (XPLMDataRef)XPLMFindDataRef(buf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,buf,&local_1d9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &vecDREdataRefStr_abi_cxx11_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_ICAO",uVar4);
    iVar3 = XPLMShareData(buf,0x20,0,0);
    if (iVar3 == 0) {
      drI.infoIcaoAcType = (XPLMDataRef)0x0;
    }
    else {
      drI.infoIcaoAcType = (XPLMDataRef)XPLMFindDataRef(buf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,buf,&local_1d9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &vecDREdataRefStr_abi_cxx11_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_manufacturer",uVar4);
    iVar3 = XPLMShareData(buf,0x20,0,0);
    if (iVar3 == 0) {
      drI.infoManufacturer = (XPLMDataRef)0x0;
    }
    else {
      drI.infoManufacturer = (XPLMDataRef)XPLMFindDataRef(buf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,buf,&local_1d9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &vecDREdataRefStr_abi_cxx11_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_model",uVar4);
    iVar3 = XPLMShareData(buf,0x20,0,0);
    if (iVar3 == 0) {
      drI.infoModel = (XPLMDataRef)0x0;
    }
    else {
      drI.infoModel = (XPLMDataRef)XPLMFindDataRef(buf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,buf,&local_1d9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &vecDREdataRefStr_abi_cxx11_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_ICAOairline",uVar4);
    iVar3 = XPLMShareData(buf,0x20,0,0);
    if (iVar3 == 0) {
      drI.infoIcaoAirline = (XPLMDataRef)0x0;
    }
    else {
      drI.infoIcaoAirline = (XPLMDataRef)XPLMFindDataRef(buf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,buf,&local_1d9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &vecDREdataRefStr_abi_cxx11_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_airline",uVar4);
    iVar3 = XPLMShareData(buf,0x20,0,0);
    if (iVar3 == 0) {
      drI.infoAirline = (XPLMDataRef)0x0;
    }
    else {
      drI.infoAirline = (XPLMDataRef)XPLMFindDataRef(buf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,buf,&local_1d9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &vecDREdataRefStr_abi_cxx11_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_flightnum",uVar4);
    iVar3 = XPLMShareData(buf,0x20,0,0);
    if (iVar3 == 0) {
      drI.infoFlightNum = (XPLMDataRef)0x0;
    }
    else {
      drI.infoFlightNum = (XPLMDataRef)XPLMFindDataRef(buf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,buf,&local_1d9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &vecDREdataRefStr_abi_cxx11_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_apt_from",uVar4);
    iVar3 = XPLMShareData(buf,0x20,0,0);
    if (iVar3 == 0) {
      drI.infoAptFrom = (XPLMDataRef)0x0;
    }
    else {
      drI.infoAptFrom = (XPLMDataRef)XPLMFindDataRef(buf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,buf,&local_1d9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &vecDREdataRefStr_abi_cxx11_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_apt_to",uVar4);
    iVar3 = XPLMShareData(buf,0x20,0,0);
    if (iVar3 == 0) {
      drI.infoAptTo = (XPLMDataRef)0x0;
    }
    else {
      drI.infoAptTo = (XPLMDataRef)XPLMFindDataRef(buf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,buf,&local_1d9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &vecDREdataRefStr_abi_cxx11_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    snprintf(buf,100,"sim/multiplayer/position/plane%u_cslModel",uVar4);
    iVar3 = XPLMShareData(buf,0x20,0,0);
    if (iVar3 == 0) {
      drI.cslModel = (XPLMDataRef)0x0;
    }
    else {
      drI.cslModel = (XPLMDataRef)XPLMFindDataRef(buf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,buf,&local_1d9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &vecDREdataRefStr_abi_cxx11_,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    std::vector<XPMP2::infoDataRefsTy,_std::allocator<XPMP2::infoDataRefsTy>_>::push_back
              ((vector<XPMP2::infoDataRefsTy,_std::allocator<XPMP2::infoDataRefsTy>_> *)&gInfoRef,
               &drI);
  }
  return;
}

Assistant:

void AIMultiInit ()
{
    // *** TCAS Target dataRefs ***
    
    // Many of these will only be available with X-Plane 11.50b8 or later
    drTcasOverride      = XPLMFindDataRef("sim/operation/override/override_TCAS");
    drMapOverride       = XPLMFindDataRef("sim/operation/override/override_multiplayer_map_layer");

    // This is probably the most important one, serving as a key,
    // but for us also as an indicator if we are in the right XP version
    // to use TCAS Override
    numSlots = 0;
    drTcasModeS         = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeS_id");
    if (GoTCASOverride())                   // we can use TCAS Override
    {
        // Let's establish array size (we shall not assume it is 64, though initially it is)
        numSlots = (size_t)XPLMGetDatavi(drTcasModeS, nullptr, 0, 0);
        if (numSlots >= 2) {                // expected is 64...just a safety check
            // Reduce by one: The user plane is off limits
            numSlots--;
            
            // Now fetch all the other dataRefs...they should work
            drTcasModeC         = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeC_code");
            drTcasFlightId      = XPLMFindDataRef("sim/cockpit2/tcas/targets/flight_id");
            drTcasIcaoType      = XPLMFindDataRef("sim/cockpit2/tcas/targets/icao_type");
            drTcasX             = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/x");
            drTcasY             = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/y");
            drTcasZ             = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/z");
            drTcasVX            = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vx");
            drTcasVY            = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vy");
            drTcasVZ            = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vz");
            drTcasVertSpeed     = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vertical_speed");
            drTcasHeading       = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/psi");
            drTcasPitch         = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/the");
            drTcasRoll          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/phi");
            drTcasGrnd          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/weight_on_wheels");
            drTcasGear          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/gear_deploy");
            drTcasFlap          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio");
            drTcasFlap2         = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio2");
            drTcasSpeedbrake    = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/speedbrake_ratio");
            drTcasSlat          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/slat_ratio");
            drTcasWingSweep     = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/wing_sweep");
            drTcasThrottle      = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/throttle");
            drTcasYokePitch     = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_pitch");     // XP12 silently corrected the spelling
            if (!drTcasYokePitch)
                drTcasYokePitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_pitch");     // XP11 had copied the original spelling mistake
            drTcasYokeRoll      = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_roll");
            if (!drTcasYokeRoll)
                drTcasYokeRoll  = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_roll");
            drTcasYokeYaw       = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_yaw");
            if (!drTcasYokeYaw)
                drTcasYokeYaw   = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_yaw");
            drTcasLights        = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/lights");
            // Wake support as of XP12, so these can fail in earlier versions:
            drTcasWakeWingSpan  = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_span_m");
            drTcasWakeWingArea  = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_area_m2");
            drTcasWakeCat       = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wake_cat");
            drTcasWakeMass      = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/mass_kg");
            drTcasWakeAoA       = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/aoa");
            drTcasWakeLift      = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/lift_N");
        } else {
            // not expected to happen, but safety measure: fallback to classic TCAS
            drTcasModeS = nullptr;
            numSlots = 0;
        }
    }
    
    // *** Legacy Multiplayer DataRefs ***
    
    // We need them only for proper initialization at the beginning
    // and when not filling all (19) slots
    char        buf[100];
    gMultiRef.clear();                      // just a safety measure against multi init
    multiDataRefsTy drM;                    // one set of dataRefs for one plane
    gMultiRef.push_back(drM);               // add an empty record at position 0 (user's plane)

    // Code for finding a standard X-Plane dataRef
#define FIND_PLANE_DR(membVar, dataRefTxt, PlaneNr)                         \
    snprintf(buf,sizeof(buf),"sim/multiplayer/position/plane%u_" dataRefTxt,PlaneNr);    \
    drM.membVar = XPLMFindDataRef(buf);

    // We don't know how many multiplayer planes there are - fetch as many as we can.
    // Loop over all possible AI/multiplayer slots
    for (unsigned nDrM = 1; true; nDrM++)
    {
        drM.clear();
        // position
        FIND_PLANE_DR(X,                    "x",                    nDrM);
        if (!drM.X) break;
        FIND_PLANE_DR(Y,                    "y",                    nDrM);
        FIND_PLANE_DR(Z,                    "z",                    nDrM);
        // cartesian velocities
        FIND_PLANE_DR(v_x,                  "v_x",                  nDrM);
        FIND_PLANE_DR(v_y,                  "v_y",                  nDrM);
        FIND_PLANE_DR(v_z,                  "v_z",                  nDrM);
        // attitude
        FIND_PLANE_DR(pitch,                "the",                  nDrM);
        FIND_PLANE_DR(roll,                 "phi",                  nDrM);
        FIND_PLANE_DR(heading,              "psi",                  nDrM);
        // configuration
        FIND_PLANE_DR(gear,                 "gear_deploy",          nDrM);
        FIND_PLANE_DR(flap,                 "flap_ratio",           nDrM);
        FIND_PLANE_DR(flap2,                "flap_ratio2",          nDrM);
        FIND_PLANE_DR(spoiler,              "spoiler_ratio",        nDrM);
        FIND_PLANE_DR(speedbrake,           "speedbrake_ratio",     nDrM);
        FIND_PLANE_DR(slat,                 "slat_ratio",           nDrM); // _should_ expect this name
        if (!drM.slat) {
            FIND_PLANE_DR(slat,             "sla1_ratio",           nDrM); // but in reality it is this
        }
        FIND_PLANE_DR(wingSweep,            "wing_sweep",           nDrM);
        FIND_PLANE_DR(throttle,             "throttle",             nDrM);
        
        // In XP12 the following classic dataRefs are considered legacy and throw user-visible warnings if used
        // I'm too lazy to use the (proper) array sim/multiplayer/controls/yoke_pitch_ratio[20] instead
        // due to that being an array dataRefs as opposed to these here using plane%u semantics.
        // But in XP12 we don't need the legacy dataRefs anyway, so we can live without these 3 if we have TCAS override:
        if (!numSlots) {
            FIND_PLANE_DR(yoke_pitch,       "yolk_pitch",           nDrM);
            FIND_PLANE_DR(yoke_roll,        "yolk_roll",            nDrM);
            FIND_PLANE_DR(yoke_yaw,         "yolk_yaw",             nDrM);
        }
        
        // lights
        FIND_PLANE_DR(bcnLights,            "beacon_lights_on",     nDrM);
        FIND_PLANE_DR(landLights,           "landing_lights_on",    nDrM);
        FIND_PLANE_DR(navLights,            "nav_lights_on",        nDrM);
        FIND_PLANE_DR(strbLights,           "strobe_lights_on",     nDrM);
        FIND_PLANE_DR(taxiLights,           "taxi_light_on",        nDrM);
        if (!drM) break;                    // break out of loop once the slot doesn't exist
        gMultiRef.push_back(drM);
    }
    
    // If using TCAS fallback with multiplayer dataRefs
    // then we set the number of slots based on available multiplayer slots
    if (!numSlots)
        numSlots = gMultiRef.size()-1;
    
    // *** Shared dataRefs for providing additional text info ***
    
    // While these had been defined to be 19 only,
    // we extend it to as many as there are TCAS targets
    gInfoRef.clear();
    infoDataRefsTy  drI;            // one set of dataRefs for one plane
    gInfoRef.push_back(drI);        // add an empty record at position 0 (user's plane)

    // Code for finding a non-standard shared dataRef for text information sharing
#define SHARE_PLANE_DR(membVar, dataRefTxt, PlaneNr)                                    \
    snprintf(buf,sizeof(buf),"sim/multiplayer/position/plane%u_" dataRefTxt,PlaneNr);   \
    if (XPLMShareData(buf, xplmType_Data, NULL, NULL)) {                                \
        drI.membVar = XPLMFindDataRef(buf);                                             \
        vecDREdataRefStr.push_back(buf);                                                \
    }                                                                                   \
    else drI.membVar = NULL;
    
    // We add as many shared info dataRefs as there are TCAS targets (probably 63)
    // or alternatively standard multiplayer dataRefs
    for (unsigned n = 1; n <= numSlots; n++)
    {
        // Shared data for providing textual info (see XPMPInfoTexts_t)
        SHARE_PLANE_DR(infoTailNum,         "tailnum",              n);
        SHARE_PLANE_DR(infoIcaoAcType,      "ICAO",                 n);
        SHARE_PLANE_DR(infoManufacturer,    "manufacturer",         n);
        SHARE_PLANE_DR(infoModel,           "model",                n);
        SHARE_PLANE_DR(infoIcaoAirline,     "ICAOairline",          n);
        SHARE_PLANE_DR(infoAirline,         "airline",              n);
        SHARE_PLANE_DR(infoFlightNum,       "flightnum",            n);
        SHARE_PLANE_DR(infoAptFrom,         "apt_from",             n);
        SHARE_PLANE_DR(infoAptTo,           "apt_to",               n);
        SHARE_PLANE_DR(cslModel,            "cslModel",             n);
        gInfoRef.push_back(drI);
    }
}